

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

sU32 ryg_dxt::MatchColorsBlock(Pixel *block,Pixel *color,sBool dither)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint local_104;
  sInt step;
  sInt lmask;
  sInt dot_1;
  sInt y;
  sInt i_3;
  sInt *dp;
  sInt *ep2;
  sInt *ep1;
  sInt err [8];
  int local_ac;
  sInt dot;
  sInt i_2;
  sInt c3Point;
  sInt halfPoint;
  sInt c0Point;
  sInt i_1;
  sInt stops [4];
  int local_7c;
  int local_78;
  sInt i;
  sInt dots [16];
  sInt dirb;
  sInt dirg;
  sInt dirr;
  sU32 mask;
  sBool dither_local;
  Pixel *color_local;
  Pixel *block_local;
  
  dirg = 0;
  iVar1 = (uint)(color->field_0).r - (uint)*(byte *)((long)color + 6);
  iVar2 = (uint)(color->field_0).g - (uint)*(byte *)((long)color + 5);
  iVar3 = (uint)(color->field_0).b - (uint)color[1].field_0.b;
  for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
    (&local_78)[local_7c] =
         (uint)*(byte *)((long)block + (long)local_7c * 4 + 2) * iVar1 +
         (uint)*(byte *)((long)block + (long)local_7c * 4 + 1) * iVar2 +
         (uint)block[local_7c].field_0.b * iVar3;
  }
  for (halfPoint = 0; halfPoint < 4; halfPoint = halfPoint + 1) {
    (&c0Point)[halfPoint] =
         (uint)*(byte *)((long)color + (long)halfPoint * 4 + 2) * iVar1 +
         (uint)*(byte *)((long)color + (long)halfPoint * 4 + 1) * iVar2 +
         (uint)color[halfPoint].field_0.b * iVar3;
  }
  iVar1 = i_1 + stops[1] >> 1;
  iVar2 = stops[1] + stops[0] >> 1;
  iVar3 = stops[0] + c0Point >> 1;
  if (dither) {
    ep2 = (sInt *)&ep1;
    dp = err + 2;
    _y = &local_78;
    iVar1 = iVar1 << 4;
    iVar2 = iVar2 << 4;
    iVar3 = iVar3 << 4;
    for (dot_1 = 0; dot_1 < 8; dot_1 = dot_1 + 1) {
      err[(long)dot_1 + -2] = 0;
    }
    for (lmask = 0; lmask < 4; lmask = lmask + 1) {
      iVar5 = *_y * 0x10 + dp[1] * 3 + *dp * 5;
      if (iVar5 < iVar2) {
        local_104 = 3;
        if (iVar5 < iVar1) {
          local_104 = 1;
        }
      }
      else {
        local_104 = 0;
        if (iVar5 < iVar3) {
          local_104 = 2;
        }
      }
      uVar4 = local_104;
      *ep2 = *_y - (&c0Point)[(int)local_104];
      iVar5 = _y[1] * 0x10 + *ep2 * 7 + dp[2] * 3 + dp[1] * 5 + *dp;
      if (iVar5 < iVar2) {
        local_104 = 3;
        if (iVar5 < iVar1) {
          local_104 = 1;
        }
      }
      else {
        local_104 = 0;
        if (iVar5 < iVar3) {
          local_104 = 2;
        }
      }
      ep2[1] = _y[1] - (&c0Point)[(int)local_104];
      uVar6 = local_104 << 2;
      iVar5 = _y[2] * 0x10 + ep2[1] * 7 + dp[3] * 3 + dp[2] * 5 + dp[1];
      if (iVar5 < iVar2) {
        local_104 = 3;
        if (iVar5 < iVar1) {
          local_104 = 1;
        }
      }
      else {
        local_104 = 0;
        if (iVar5 < iVar3) {
          local_104 = 2;
        }
      }
      ep2[2] = _y[2] - (&c0Point)[(int)local_104];
      uVar7 = local_104 << 4;
      iVar5 = _y[3] * 0x10 + ep2[2] * 7 + dp[3] * 5 + dp[2];
      if (iVar5 < iVar2) {
        local_104 = 3;
        if (iVar5 < iVar1) {
          local_104 = 1;
        }
      }
      else {
        local_104 = 0;
        if (iVar5 < iVar3) {
          local_104 = 2;
        }
      }
      ep2[3] = _y[3] - (&c0Point)[(int)local_104];
      sSwap<int*>(&ep2,&dp);
      _y = _y + 4;
      dirg = (local_104 << 6 | uVar7 | uVar6 | uVar4) << ((byte)(lmask << 3) & 0x1f) | dirg;
    }
  }
  else {
    for (local_ac = 0xf; -1 < local_ac; local_ac = local_ac + -1) {
      iVar5 = (&local_78)[local_ac];
      if (iVar5 < iVar2) {
        uVar4 = 3;
        if (iVar5 < iVar1) {
          uVar4 = 1;
        }
      }
      else {
        uVar4 = 0;
        if (iVar5 < iVar3) {
          uVar4 = 2;
        }
      }
      dirg = uVar4 | dirg << 2;
    }
  }
  return dirg;
}

Assistant:

static sU32 MatchColorsBlock(const Pixel* block, const Pixel* color, sBool dither) {
  sU32 mask = 0;
  sInt dirr = color[0].r - color[1].r;
  sInt dirg = color[0].g - color[1].g;
  sInt dirb = color[0].b - color[1].b;

  sInt dots[16];
  for (sInt i = 0; i < 16; i++)
    dots[i] = block[i].r * dirr + block[i].g * dirg + block[i].b * dirb;

  sInt stops[4];
  for (sInt i = 0; i < 4; i++)
    stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;

  sInt c0Point = (stops[1] + stops[3]) >> 1;
  sInt halfPoint = (stops[3] + stops[2]) >> 1;
  sInt c3Point = (stops[2] + stops[0]) >> 1;

  if (!dither) {
    // the version without dithering is straightforward
    for (sInt i = 15; i >= 0; i--) {
      mask <<= 2;
      sInt dot = dots[i];

      if (dot < halfPoint)
        mask |= (dot < c0Point) ? 1 : 3;
      else
        mask |= (dot < c3Point) ? 2 : 0;
    }
  } else {
    // with floyd-steinberg dithering (see above)
    sInt err[8], *ep1 = err, *ep2 = err + 4;
    sInt* dp = dots;

    c0Point <<= 4;
    halfPoint <<= 4;
    c3Point <<= 4;
    for (sInt i = 0; i < 8; i++)
      err[i] = 0;

    for (sInt y = 0; y < 4; y++) {
      sInt dot, lmask, step;

      // pixel 0
      dot = (dp[0] << 4) + (3 * ep2[1] + 5 * ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[0] = dp[0] - stops[step];
      lmask = step;

      // pixel 1
      dot = (dp[1] << 4) + (7 * ep1[0] + 3 * ep2[2] + 5 * ep2[1] + ep2[0]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[1] = dp[1] - stops[step];
      lmask |= step << 2;

      // pixel 2
      dot = (dp[2] << 4) + (7 * ep1[1] + 3 * ep2[3] + 5 * ep2[2] + ep2[1]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[2] = dp[2] - stops[step];
      lmask |= step << 4;

      // pixel 3
      dot = (dp[3] << 4) + (7 * ep1[2] + 5 * ep2[3] + ep2[2]);
      if (dot < halfPoint)
        step = (dot < c0Point) ? 1 : 3;
      else
        step = (dot < c3Point) ? 2 : 0;

      ep1[3] = dp[3] - stops[step];
      lmask |= step << 6;

      // advance to next line
      sSwap(ep1, ep2);
      dp += 4;
      mask |= lmask << (y * 8);
    }
  }

  return mask;
}